

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus Decode2RImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t in_RCX;
  uint *in_RDX;
  undefined4 in_ESI;
  MCInst *in_RDI;
  DecodeStatus S;
  uint Op2;
  uint Op1;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  DVar1 = Decode2OpInstruction
                    ((uint)in_RDI,(uint *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  if (DVar1 == MCDisassembler_Success) {
    MCOperand_CreateImm0(in_RDI,(ulong)in_stack_ffffffffffffffd4);
    DecodeGRRegsRegisterClass
              ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = Decode2OpInstructionFail
                        ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                         (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return local_4;
}

Assistant:

static DecodeStatus Decode2RImmInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2;
	DecodeStatus S = Decode2OpInstruction(Insn, &Op1, &Op2);
	if (S != MCDisassembler_Success)
		return Decode2OpInstructionFail(Inst, Insn, Address, Decoder);

	MCOperand_CreateImm0(Inst, Op1);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);

	return S;
}